

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::APIErrors::depthRangeArrayHelper<float>
          (APIErrors *this,DepthFuncWrapper *depthFunc,GLint max_viewports,bool *test_result,
          float *param_4)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  vector<float,_std::allocator<float>_> data;
  
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&data,(long)(max_viewports * 2));
  lVar1 = 0;
  iVar2 = 0;
  if (0 < max_viewports) {
    iVar2 = max_viewports;
  }
  for (uVar3 = 0; (uint)(iVar2 * 2) != uVar3; uVar3 = uVar3 + 2) {
    *(undefined4 *)
     ((long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start + (lVar1 >> 0x1e)) = 0;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [(int)uVar3 + 1] = 1.0;
    lVar1 = lVar1 + 0x200000000;
  }
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (0,max_viewports + -1,
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  checkGLError(this,0,"depthRangeArray, correct parameters",test_result);
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (max_viewports,1,
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  checkGLError(this,0x501,"depthRangeArray, <first> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (1,max_viewports + -1,
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  checkGLError(this,0,"depthRangeArray, <first> + <count> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (1,max_viewports,
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  checkGLError(this,0x501,"depthRangeArray, <first> + <count> > GL_MAX_VIEWPORTS",test_result);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void APIErrors::depthRangeArrayHelper(Utils::DepthFuncWrapper& depthFunc, GLint max_viewports, bool& test_result, T*)
{
	std::vector<T> data;
	data.resize(max_viewports * 2 /* near + far */);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		data[i * 2]		= (T)0.0;
		data[i * 2 + 1] = (T)1.0;
	}

	depthFunc.depthRangeArray(0, max_viewports - 1, &data[0]);
	checkGLError(GL_NO_ERROR, "depthRangeArray, correct parameters", test_result);

	depthFunc.depthRangeArray(max_viewports, 1, &data[0]);
	checkGLError(GL_INVALID_VALUE, "depthRangeArray, <first> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeArray(1, max_viewports - 1, &data[0]);
	checkGLError(GL_NO_ERROR, "depthRangeArray, <first> + <count> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeArray(1, max_viewports, &data[0]);
	checkGLError(GL_INVALID_VALUE, "depthRangeArray, <first> + <count> > GL_MAX_VIEWPORTS", test_result);
}